

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

dtree_t * mk_tree_comp(float32 ****mixw,float32 ****means,float32 ****vars,uint32 *veclen,
                      uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,float32 *stwt,
                      uint32 *id,uint32 n_id,quest_t *all_q,uint32 n_all_q,pset_t *pset,
                      uint32 n_base_phone,uint32 **dfeat,uint32 n_dfeat,uint32 split_min,
                      uint32 split_max,float32 split_thr,uint32 split_min_comp,uint32 split_max_comp
                      ,float32 split_thr_comp,float32 mwfloor)

{
  dtree_t *tr;
  dtree_node_t *node;
  comp_quest_t *pcVar1;
  dtree_node_t *pdVar2;
  uint uVar3;
  ulong uVar4;
  uint32 in_stack_ffffffffffffff58;
  
  tr = (dtree_t *)
       __ckd_calloc__(1,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                      ,0x509);
  node = (dtree_node_t *)
         __ckd_calloc__((ulong)(split_max_comp * 2 + 1),0x68,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                        ,0x50a);
  tr->node = node;
  tr->n_node = 0;
  node->node_id = 0;
  tr->n_node = 1;
  mk_node(node,0,id,n_id,mixw,means,vars,veclen,in_stack_ffffffffffffff58,n_state,n_stream,n_density
          ,stwt,mwfloor);
  pcVar1 = mk_comp_quest(&node->wt_ent_dec,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density
                         ,stwt,id,n_id,all_q,n_all_q,pset,n_base_phone,dfeat,n_dfeat,split_min,
                         split_max,split_thr,mwfloor);
  node->q = pcVar1;
  if (split_max_comp != 0) {
    uVar4 = 0;
    do {
      pdVar2 = best_leaf_node(node);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
              ,0x523,"Comp split %u\n",uVar4);
      if (pdVar2 == (dtree_node_t *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                ,0x526,"stop. leaf nodes are specific\n");
        return tr;
      }
      if ((double)pdVar2->wt_ent_dec <= 0.0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                ,0x52d,"stop. b_n->wt_ent_dec (%.3e) <= 0\n");
        return tr;
      }
      if ((split_min_comp < (uint)uVar4) &&
         ((double)pdVar2->wt_ent_dec < (double)pdVar2->wt_ent * (double)(float)split_thr_comp)) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                ,0x533,"stop. b_n->wt_ent_dec <= split_thr_comp * b_n->wt_ent. %.3e <= %.3e\n");
        return tr;
      }
      split_node_comp(tr,pdVar2->node_id,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,
                      stwt,all_q,n_all_q,pset,n_base_phone,dfeat,n_dfeat,split_min,split_max,
                      split_thr,mwfloor);
      uVar3 = (uint)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (split_max_comp != uVar3);
  }
  return tr;
}

Assistant:

dtree_t *
mk_tree_comp(float32 ****mixw,
             float32 ****means, 
             float32 ****vars, 
             uint32  *veclen,
	     uint32 n_model,
	     uint32 n_state,
	     uint32 n_stream,
	     uint32 n_density,
	     float32 *stwt,
	
	     uint32 *id,
	     uint32 n_id,

	     quest_t *all_q,
	     uint32 n_all_q,
	     pset_t *pset,
	     uint32 n_base_phone,
	     
	     uint32 **dfeat,
	     uint32 n_dfeat,

	     uint32  split_min,
	     uint32  split_max,
	     float32 split_thr,

	     uint32  split_min_comp,
	     uint32  split_max_comp,
	     float32 split_thr_comp,

	     float32 mwfloor)
{
    dtree_t *comp_tree;
    dtree_node_t *root, *b_n;
    uint32 i;

    comp_tree = ckd_calloc(1, sizeof(dtree_t));
    comp_tree->node = ckd_calloc(2*split_max_comp+1, sizeof(dtree_node_t));
    comp_tree->n_node = 0;

    comp_tree->node[0].node_id = 0;
    comp_tree->n_node = 1;
    
    root = &comp_tree->node[0];

    mk_node(root, 0,
	    id, n_id,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    root->q = (void *)mk_comp_quest(&root->wt_ent_dec,
				    mixw, means, vars, veclen, 
                                    n_model, n_state, n_stream, n_density, stwt,
				    id, n_id,
				    all_q, n_all_q, pset, n_base_phone,
				    dfeat, n_dfeat,
				    split_min, split_max, split_thr,
				    mwfloor);
    
    for (i = 0; i < split_max_comp; i++) {
	b_n = best_leaf_node(root);

	E_INFO("Comp split %u\n", i);

	if (b_n == NULL) {
	    E_INFO("stop. leaf nodes are specific\n");

	    break;
	}

	if (b_n->wt_ent_dec <= 0) {
	    E_INFO("stop. b_n->wt_ent_dec (%.3e) <= 0\n",
		   b_n->wt_ent_dec);
	    break;
	}
	if ((i > split_min_comp) &&
	    (b_n->wt_ent_dec < split_thr_comp * b_n->wt_ent)) {
	    E_INFO("stop. b_n->wt_ent_dec <= split_thr_comp * b_n->wt_ent. %.3e <= %.3e\n",
		   b_n->wt_ent_dec, split_thr_comp * b_n->wt_ent);
	    break;
	}
		   
	split_node_comp(comp_tree, b_n->node_id,
			mixw, means, vars, veclen, 
                        n_model, n_state, n_stream, n_density, stwt,
			all_q, n_all_q, pset, n_base_phone,
			dfeat, n_dfeat,
			split_min, split_max, split_thr, mwfloor);

#if 0
	printf("Comp Split %u:\n", i);
	print_tree_comp(stderr, "*", root, pset, 0);
	fprintf(stderr, "\n");
#endif
    }

#if 0
    E_INFO("Final Comp Tree %u:\n", i);
    print_tree_comp(stderr, "", root, pset, 0);
    fprintf(stderr, "\n");
#endif

    return comp_tree;
}